

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O3

bool __thiscall
google::protobuf::util::MessageDifferencer::IsIgnored
          (MessageDifferencer *this,Message *message1,Message *message2,FieldDescriptor *field,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  pointer puVar1;
  pointer puVar2;
  IgnoreCriteria *pIVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  pointer puVar7;
  FieldDescriptor *local_58;
  iterator local_50;
  iterator local_40;
  
  local_58 = field;
  local_40 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FieldDescriptor_const*>>
             ::find<google::protobuf::FieldDescriptor_const*>
                       ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FieldDescriptor_const*>>
                         *)&this->ignored_fields_,&local_58);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::AssertNotDebugCapacity
            (&(this->ignored_fields_).
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            );
  local_50.ctrl_ = (ctrl_t *)0x0;
  bVar4 = absl::lts_20250127::container_internal::operator==(&local_40,&local_50);
  cVar5 = '\x01';
  if (bVar4) {
    puVar1 = (this->ignore_criteria_).
             super__Vector_base<std::unique_ptr<google::protobuf::util::MessageDifferencer::IgnoreCriteria,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>,_std::allocator<std::unique_ptr<google::protobuf::util::MessageDifferencer::IgnoreCriteria,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->ignore_criteria_).
             super__Vector_base<std::unique_ptr<google::protobuf::util::MessageDifferencer::IgnoreCriteria,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>,_std::allocator<std::unique_ptr<google::protobuf::util::MessageDifferencer::IgnoreCriteria,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar1 == puVar2) {
      cVar5 = '\0';
    }
    else {
      do {
        puVar7 = puVar1 + 1;
        pIVar3 = (puVar1->_M_t).
                 super___uniq_ptr_impl<google::protobuf::util::MessageDifferencer::IgnoreCriteria,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
                 .
                 super__Head_base<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_false>
                 ._M_head_impl;
        iVar6 = (*pIVar3->_vptr_IgnoreCriteria[2])(pIVar3,message1,message2,local_58,parent_fields);
        if ((char)iVar6 != '\0') {
          return (bool)(char)iVar6;
        }
        cVar5 = '\0';
        puVar1 = puVar7;
      } while (puVar7 != puVar2);
    }
  }
  return (bool)cVar5;
}

Assistant:

bool MessageDifferencer::IsIgnored(
    const Message& message1, const Message& message2,
    const FieldDescriptor* field,
    const std::vector<SpecificField>& parent_fields) {
  if (ignored_fields_.find(field) != ignored_fields_.end()) {
    return true;
  }
  for (const auto& criteria : ignore_criteria_) {
    if (criteria->IsIgnored(message1, message2, field, parent_fields)) {
      return true;
    }
  }
  return false;
}